

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.hpp
# Opt level: O0

void __thiscall
Triangle::Triangle(Triangle *this,vec3f v1,vec3f v2,vec3f v3,vec2f vt1,vec2f vt2,vec2f vt3,vec3f vn1
                  ,vec3f vn2,vec3f vn3)

{
  mat3f a;
  data_t dVar1;
  vec3f vVar2;
  undefined4 in_stack_fffffffffffffc5c;
  data_t dVar3;
  undefined4 uStack_39c;
  vec3f local_320;
  vec3f local_310;
  vec3f local_300;
  vec3f local_2f0;
  vec3f local_2e4;
  vec3f local_2d8;
  vec3f local_2c8;
  vec3f local_2b8;
  vec3f local_2a8;
  mat3f local_298;
  undefined1 local_274 [36];
  vec3f local_250;
  vec3f local_240;
  vec3f local_230;
  vec3f local_220;
  vec3f local_210;
  vec3f local_200;
  undefined8 local_1f0;
  data_t local_1e8;
  vec3f local_1e0;
  vec3f local_1d0;
  vec3f local_1c0;
  vec3f local_1b0;
  vec3f local_1a0;
  vec3f local_190;
  undefined8 local_184;
  data_t local_17c;
  vec3f local_178;
  vec3f local_168;
  vec3f local_158;
  vec3f local_148;
  vec3f local_138;
  vec3f local_128;
  vec3f local_118;
  vec3f local_108;
  vec3f local_f8;
  vec3f local_ec;
  vec3f local_e0;
  vec3f local_cc;
  vec3f local_c0;
  vec3f local_ac;
  vec3f local_a0;
  vec3f local_8c;
  Triangle *local_80;
  Triangle *this_local;
  vec2f vt2_local;
  vec2f vt1_local;
  undefined1 local_58 [8];
  vec3f v3_local;
  undefined1 local_38 [8];
  vec3f v2_local;
  undefined1 local_18 [8];
  vec3f v1_local;
  
  v3_local.x = v3.z;
  local_58 = v3._0_8_;
  v2_local.x = v2.z;
  register0x00001280 = v2._0_8_;
  v1_local.x = v1.z;
  unique0x10000179 = v1._0_8_;
  local_80 = this;
  this_local = (Triangle *)vt2;
  vt2_local = vt1;
  local_38 = (undefined1  [8])register0x00001280;
  local_18 = (undefined1  [8])unique0x10000179;
  BasicPrimitive::BasicPrimitive(&this->super_BasicPrimitive);
  vVar2 = vn1;
  (this->super_BasicPrimitive).super_Primitive._vptr_Primitive =
       (_func_int **)&PTR_intersect_00266b20;
  (this->v1).z = v1_local.x;
  (this->v1).x = (data_t)local_18._0_4_;
  (this->v1).y = (data_t)local_18._4_4_;
  (this->v2).z = v2_local.x;
  (this->v2).x = (data_t)local_38._0_4_;
  (this->v2).y = (data_t)local_38._4_4_;
  (this->v3).z = v3_local.x;
  (this->v3).x = (data_t)local_58._0_4_;
  (this->v3).y = (data_t)local_58._4_4_;
  (this->vn1).z = vn1.z;
  (this->vn1).x = vn1.x;
  (this->vn1).y = vn1.y;
  (this->vn2).z = vn2.z;
  (this->vn2).x = vn2.x;
  (this->vn2).y = vn2.y;
  (this->vn3).z = vn3.z;
  (this->vn3).x = vn3.x;
  (this->vn3).y = vn3.y;
  this->vt1 = vt2_local;
  this->vt2 = (vec2f)this_local;
  this->vt3 = vt3;
  vn1 = vVar2;
  mat3f::mat3f(&this->tMatrix);
  vec3f::vec3f(&this->planeNormal);
  vVar2 = ::operator-((vec3f *)local_18,(vec3f *)local_38);
  local_a0.z = vVar2.z;
  local_a0._0_8_ = vVar2._0_8_;
  local_8c._0_8_ = local_a0._0_8_;
  local_8c.z = local_a0.z;
  dVar1 = norm(&local_8c);
  if (dVar1 <= 0.0) {
    __assert_fail("norm(v1-v2)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x18,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  vVar2 = ::operator-((vec3f *)local_18,(vec3f *)local_58);
  local_c0.z = vVar2.z;
  local_c0._0_8_ = vVar2._0_8_;
  local_ac._0_8_ = local_c0._0_8_;
  local_ac.z = local_c0.z;
  dVar1 = norm(&local_ac);
  if (dVar1 <= 0.0) {
    __assert_fail("norm(v1-v3)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x19,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  vVar2 = ::operator-((vec3f *)local_38,(vec3f *)local_58);
  local_e0.z = vVar2.z;
  local_e0._0_8_ = vVar2._0_8_;
  local_cc._0_8_ = local_e0._0_8_;
  local_cc.z = local_e0.z;
  dVar1 = norm(&local_cc);
  if (dVar1 <= 0.0) {
    __assert_fail("norm(v2-v3)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                  ,0x1a,
                  "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)"
                 );
  }
  vVar2 = ::operator-((vec3f *)local_38,(vec3f *)local_18);
  local_118.z = vVar2.z;
  local_118._0_8_ = vVar2._0_8_;
  local_108._0_8_ = local_118._0_8_;
  local_108.z = local_118.z;
  vVar2 = normalized(&local_108);
  local_128.z = vVar2.z;
  local_128._0_8_ = vVar2._0_8_;
  local_f8._0_8_ = local_128._0_8_;
  local_f8.z = local_128.z;
  vVar2 = ::operator-((vec3f *)local_58,(vec3f *)local_18);
  local_158.z = vVar2.z;
  local_158._0_8_ = vVar2._0_8_;
  local_148._0_8_ = local_158._0_8_;
  local_148.z = local_158.z;
  vVar2 = normalized(&local_148);
  local_168.z = vVar2.z;
  local_168._0_8_ = vVar2._0_8_;
  local_138._0_8_ = local_168._0_8_;
  local_138.z = local_168.z;
  vVar2 = cross(&local_f8,&local_138);
  local_178.z = vVar2.z;
  local_178._0_8_ = vVar2._0_8_;
  local_ec._0_8_ = local_178._0_8_;
  local_ec.z = local_178.z;
  dVar1 = norm(&local_ec);
  if (1e-09 < dVar1) {
    vVar2 = ::operator-((vec3f *)local_38,(vec3f *)local_18);
    local_1b0.z = vVar2.z;
    local_1b0._0_8_ = vVar2._0_8_;
    local_1a0._0_8_ = local_1b0._0_8_;
    local_1a0.z = local_1b0.z;
    vVar2 = ::operator-((vec3f *)local_58,(vec3f *)local_18);
    local_1d0.z = vVar2.z;
    local_1d0._0_8_ = vVar2._0_8_;
    local_1c0._0_8_ = local_1d0._0_8_;
    local_1c0.z = local_1d0.z;
    vVar2 = cross(&local_1a0,&local_1c0);
    local_1e0.z = vVar2.z;
    local_1e0._0_8_ = vVar2._0_8_;
    local_190._0_8_ = local_1e0._0_8_;
    local_190.z = local_1e0.z;
    vVar2 = normalized(&local_190);
    local_1e8 = vVar2.z;
    local_1f0 = vVar2._0_8_;
    (this->planeNormal).x = (data_t)(int)local_1f0;
    (this->planeNormal).y = (data_t)(int)((ulong)local_1f0 >> 0x20);
    (this->planeNormal).z = local_1e8;
    local_184 = local_1f0;
    local_17c = local_1e8;
    dVar1 = dot(&this->planeNormal,&vn1);
    if (dVar1 < 0.0) {
      operator*=(&this->planeNormal,-1.0);
    }
    vVar2 = ::operator-((vec3f *)local_58,(vec3f *)local_18);
    local_220.z = vVar2.z;
    local_220._0_8_ = vVar2._0_8_;
    dVar3 = SUB84((vec3f *)local_38,0);
    uStack_39c = (undefined4)((ulong)local_38 >> 0x20);
    local_210._0_8_ = local_220._0_8_;
    local_210.z = local_220.z;
    vVar2 = ::operator-((vec3f *)local_38,(vec3f *)local_18);
    local_240.z = vVar2.z;
    local_240._0_8_ = vVar2._0_8_;
    local_230._0_8_ = local_240._0_8_;
    local_230.z = local_240.z;
    vVar2 = cross(&local_210,&local_230);
    local_250.z = vVar2.z;
    local_250._0_8_ = vVar2._0_8_;
    local_200._0_8_ = local_250._0_8_;
    local_200.z = local_250.z;
    dVar1 = norm(&local_200);
    this->one_by_2S = 1.0 / dVar1;
    vVar2 = ::operator-((vec3f *)CONCAT44(uStack_39c,dVar3),(vec3f *)local_18);
    local_2b8.z = vVar2.z;
    local_2b8._0_8_ = vVar2._0_8_;
    local_2a8._0_8_ = local_2b8._0_8_;
    local_2a8.z = local_2b8.z;
    vVar2 = ::operator-((vec3f *)local_58,(vec3f *)local_18);
    local_2d8.z = vVar2.z;
    local_2d8._0_8_ = vVar2._0_8_;
    local_2c8._0_8_ = local_2d8._0_8_;
    local_2c8.z = local_2d8.z;
    vVar2 = ::operator-((vec3f *)CONCAT44(uStack_39c,dVar3),(vec3f *)local_18);
    local_300.z = vVar2.z;
    local_300._0_8_ = vVar2._0_8_;
    local_2f0._0_8_ = local_300._0_8_;
    local_2f0.z = local_300.z;
    vVar2 = ::operator-((vec3f *)local_58,(vec3f *)local_18);
    local_320.z = vVar2.z;
    local_320._0_8_ = vVar2._0_8_;
    vVar2 = normalized(&local_320);
    local_310.z = vVar2.z;
    local_310._0_8_ = vVar2._0_8_;
    vVar2 = cross(&local_2f0,&local_310);
    local_2e4.z = vVar2.z;
    local_2e4._0_8_ = vVar2._0_8_;
    mat3f::mat3f(&local_298,&local_2a8,&local_2c8,&local_2e4);
    a.data[0][2] = local_298.data[1][1];
    a.data[1][0] = local_298.data[1][2];
    a.data[0][0] = local_298.data[0][2];
    a.data[0][1] = local_298.data[1][0];
    a.data[1][1] = local_298.data[2][0];
    a.data[1][2] = local_298.data[2][1];
    a.data[2][0] = local_298.data[2][2];
    a.data[2][1] = (data_t)in_stack_fffffffffffffc5c;
    a.data[2][2] = dVar3;
    inverse(a);
    memcpy(&this->tMatrix,local_274,0x24);
    return;
  }
  __assert_fail("norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9",
                "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/rt/triangle.hpp"
                ,0x1b,
                "Triangle::Triangle(vec3f, vec3f, vec3f, vec2f, vec2f, vec2f, vec3f, vec3f, vec3f)")
  ;
}

Assistant:

Triangle(vec3f v1, vec3f v2, vec3f v3, vec2f vt1, vec2f vt2, vec2f vt3, vec3f vn1, vec3f vn2, vec3f vn3):
		v1(v1), v2(v2), v3(v3), vn1(vn1), vn2(vn2), vn3(vn3), vt1(vt1), vt2(vt2), vt3(vt3)
	// pre-calculation to accelerate intersection / interpolation computation
	{
		// NOTE: be careful when dealing with tiny triangles!
		assert(norm(v1-v2)>0);
		assert(norm(v1-v3)>0);
		assert(norm(v2-v3)>0);
		assert(norm(cross(normalized(v2-v1), normalized(v3-v1))) > 1e-9);

		planeNormal = normalized(cross(v2-v1, v3-v1));
		// make sure plane normal points outward
		if (dot(planeNormal, vn1) < 0)
			planeNormal *= -1;
		one_by_2S = 1 / norm(cross(v3-v1, v2-v1));
		tMatrix = inverse(mat3f(v2-v1, v3-v1, cross(v2-v1, normalized(v3-v1))));
	}